

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_dispatch.c
# Opt level: O0

cpu_feature get_cpu_features(void)

{
  uint64_t uVar1;
  uint64_t mask;
  int max_id;
  cpu_feature features;
  uint32_t *edx;
  uint32_t *ecx;
  uint32_t *ebx;
  uint32_t *eax;
  uint32_t regs [4];
  cpu_feature local_3c;
  uint32_t local_18;
  uint local_14;
  uint local_10;
  cpu_feature local_4;
  
  if (g_cpu_features == UNDEFINED) {
    memset(&local_18,0,0x10);
    cpuid(&local_18,0);
    cpuid(&local_18,1);
    local_3c = SSE2;
    if ((local_10 & 1) != 0) {
      local_3c = SSSE3|SSE2;
    }
    if ((local_10 & 0x80000) != 0) {
      local_3c = local_3c | SSE41;
    }
    if (((local_10 & 0x8000000) != 0) && (uVar1 = xgetbv(), (uVar1 & 6) == 6)) {
      if ((local_10 & 0x10000000) != 0) {
        local_3c = local_3c | AVX;
      }
      if (6 < (int)local_18) {
        cpuidex(&local_18,7,0);
        if ((local_14 & 0x20) != 0) {
          local_3c = local_3c | AVX2;
        }
        if ((uVar1 & 0xe0) == 0xe0) {
          if ((local_14 & 0x80000000) != 0) {
            local_3c = local_3c | AVX512VL;
          }
          if ((local_14 & 0x10000) != 0) {
            local_3c = local_3c | AVX512F;
          }
        }
      }
    }
    local_4 = local_3c;
  }
  else {
    local_4 = g_cpu_features;
  }
  g_cpu_features = local_4;
  return local_4;
}

Assistant:

enum cpu_feature
    get_cpu_features() {

  if (g_cpu_features != UNDEFINED) {
    return g_cpu_features;
  } else {
#if defined(IS_X86)
    uint32_t regs[4] = {0};
    uint32_t *eax = &regs[0], *ebx = &regs[1], *ecx = &regs[2], *edx = &regs[3];
    (void)edx;
    enum cpu_feature features = 0;
    cpuid(regs, 0);
    const int max_id = *eax;
    cpuid(regs, 1);
#if defined(__amd64__) || defined(_M_X64)
    features |= SSE2;
#else
    if (*edx & (1UL << 26))
      features |= SSE2;
#endif
    if (*ecx & (1UL << 0))
      features |= SSSE3;
    if (*ecx & (1UL << 19))
      features |= SSE41;

    if (*ecx & (1UL << 27)) { // OSXSAVE
      const uint64_t mask = xgetbv();
      if ((mask & 6) == 6) { // SSE and AVX states
        if (*ecx & (1UL << 28))
          features |= AVX;
        if (max_id >= 7) {
          cpuidex(regs, 7, 0);
          if (*ebx & (1UL << 5))
            features |= AVX2;
          if ((mask & 224) == 224) { // Opmask, ZMM_Hi256, Hi16_Zmm
            if (*ebx & (1UL << 31))
              features |= AVX512VL;
            if (*ebx & (1UL << 16))
              features |= AVX512F;
          }
        }
      }
    }
    g_cpu_features = features;
    return features;
#else
    /* How to detect NEON? */
    return 0;
#endif
  }
}